

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decAbc.c
# Opt level: O1

Ivy_Obj_t * Dec_GraphToNetworkIvy(Ivy_Man_t *pMan,Dec_Graph_t *pGraph)

{
  uint uVar1;
  Dec_Node_t *pDVar2;
  long lVar3;
  Ivy_Obj_t *pIVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  
  if (pGraph->fConst == 0) {
    uVar5 = (uint)pGraph->eRoot >> 1 & 0x3fffffff;
    lVar6 = (long)pGraph->nLeaves;
    if (uVar5 < (uint)pGraph->nLeaves) {
      pIVar4 = (Ivy_Obj_t *)
               ((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)pGraph->pNodes[uVar5].field_2.pFunc);
    }
    else {
      lVar3 = lVar6 * 0x18 + 8;
      do {
        lVar7 = lVar3;
        pDVar2 = pGraph->pNodes;
        uVar5 = *(uint *)((long)pDVar2 + lVar7 + -8);
        uVar1 = *(uint *)((long)pDVar2 + lVar7 + -4);
        pIVar4 = Ivy_And(pMan,(Ivy_Obj_t *)
                              ((ulong)(uVar5 & 1) ^
                              (ulong)pDVar2[uVar5 >> 1 & 0x3fffffff].field_2.pFunc),
                         (Ivy_Obj_t *)
                         ((ulong)(uVar1 & 1) ^ (ulong)pDVar2[uVar1 >> 1 & 0x3fffffff].field_2.pFunc)
                        );
        *(Ivy_Obj_t **)(&(pDVar2->eEdge0).field_0x0 + lVar7) = pIVar4;
        lVar6 = lVar6 + 1;
        lVar3 = lVar7 + 0x18;
      } while (lVar6 < pGraph->nSize);
      pIVar4 = (Ivy_Obj_t *)
               ((ulong)((uint)pGraph->eRoot & 1) ^ *(ulong *)(&(pDVar2->eEdge0).field_0x0 + lVar7));
    }
  }
  else {
    pIVar4 = (Ivy_Obj_t *)((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)pMan->pConst1);
  }
  return pIVar4;
}

Assistant:

Ivy_Obj_t * Dec_GraphToNetworkIvy( Ivy_Man_t * pMan, Dec_Graph_t * pGraph )
{
    Dec_Node_t * pNode = NULL; // Suppress "might be used uninitialized"
    Ivy_Obj_t * pAnd0, * pAnd1;
    int i;
    // check for constant function
    if ( Dec_GraphIsConst(pGraph) )
        return Ivy_NotCond( Ivy_ManConst1(pMan), Dec_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Dec_GraphIsVar(pGraph) )
        return Ivy_NotCond( (Ivy_Obj_t *)Dec_GraphVar(pGraph)->pFunc, Dec_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
    Dec_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = Ivy_NotCond( (Ivy_Obj_t *)Dec_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        pAnd1 = Ivy_NotCond( (Ivy_Obj_t *)Dec_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        pNode->pFunc = Ivy_And( pMan, pAnd0, pAnd1 );
    }
    // complement the result if necessary
    return Ivy_NotCond( (Ivy_Obj_t *)pNode->pFunc, Dec_GraphIsComplement(pGraph) );
}